

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

StructMappingInfo *
duckdb::AddFieldToStruct
          (StructMappingInfo *__return_storage_ptr__,LogicalType *type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_path,ColumnDefinition *new_field,idx_t depth)

{
  size_type __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  pointer pcVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  LogicalType *pLVar7;
  pointer ppVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  string *psVar12;
  LogicalType *pLVar13;
  ParsedExpression *pPVar14;
  undefined1 this [8];
  const_reference pvVar15;
  BinderException *pBVar16;
  pointer *__ptr;
  pointer l1;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  child_list_t<LogicalType> child_list;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_318;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_310;
  pointer local_308;
  pointer ppStack_300;
  pointer local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_2f0;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [8];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_280 [56];
  idx_t local_248;
  CatalogException local_240;
  undefined1 local_230 [8];
  _Alloc_hider local_228;
  undefined1 auStack_220 [24];
  string local_208 [16];
  undefined1 local_1f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e8 [56];
  LogicalType local_1b0;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Value local_118;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  child_list_t<LogicalType> local_c8;
  child_list_t<LogicalType> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (type->id_ != STRUCT) {
    pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
    local_2e8._0_8_ = local_2e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,
               "Column %s is not a struct - ALTER TABLE can only add fields to structs","");
    pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](column_path,depth);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar4 = (pvVar15->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,pcVar4 + pvVar15->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar16,(string *)local_2e8,&local_50);
    __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LogicalType::LogicalType((LogicalType *)local_2e8);
  local_2e8._24_8_ = (ConstantExpression *)0x0;
  ErrorData::ErrorData((ErrorData *)local_2c8);
  __x = &StructType::GetChildTypes_abi_cxx11_(type)->
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_308,__x);
  ppVar8 = ppStack_300;
  __n = depth + 1;
  l1 = local_308;
  if ((long)(column_path->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(column_path->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 == __n) {
    for (; l1 != ppVar8; l1 = l1 + 1) {
      psVar12 = ColumnDefinition::Name_abi_cxx11_(new_field);
      bVar11 = StringUtil::CIEquals(&l1->first,psVar12);
      if (bVar11) {
        local_118.type_._0_8_ =
             (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_118 + 0x10U);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"Duplicate field \"%s\" - field already exists in struct %s"
                   ,"");
        psVar12 = ColumnDefinition::Name_abi_cxx11_(new_field);
        pcVar4 = (psVar12->_M_dataplus)._M_p;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,pcVar4,pcVar4 + psVar12->_M_string_length);
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::back(column_path);
        pcVar4 = (pvVar15->_M_dataplus)._M_p;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar4,pcVar4 + pvVar15->_M_string_length);
        CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                  (&local_240,(string *)&local_118,&local_138,&local_158);
        ErrorData::ErrorData((ErrorData *)local_230,(exception *)&local_240);
        local_2c8._0_2_ = local_230._0_2_;
        ::std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_228);
        ::std::__cxx11::string::operator=((string *)&local_2a0,local_208);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign(local_280,local_1e8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_1e8);
        if ((undefined1 *)local_208._0_8_ != local_1f8) {
          operator_delete((void *)local_208._0_8_);
        }
        if ((element_type *)local_228._M_p != (element_type *)(auStack_220 + 8)) {
          operator_delete(local_228._M_p);
        }
        ::std::runtime_error::~runtime_error((runtime_error *)&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_118.type_._0_8_ !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_118 + 0x10U)) {
          operator_delete((void *)local_118.type_._0_8_);
        }
        LogicalType::LogicalType(&__return_storage_ptr__->new_type,(LogicalType *)local_2e8);
        (__return_storage_ptr__->default_value).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)local_2e8._24_8_;
        (__return_storage_ptr__->error).initialized = (bool)local_2c8[0];
        (__return_storage_ptr__->error).type = local_2c8[1];
        paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_p == &local_2b0) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
               local_2b0._8_8_;
        }
        else {
          (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = local_2c0._M_p;
          (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
               CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]);
        }
        (__return_storage_ptr__->error).raw_message._M_string_length = local_2b8;
        paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p == &local_290) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
               local_290._8_8_;
        }
        else {
          (__return_storage_ptr__->error).final_message._M_dataplus._M_p = local_2a0._M_p;
          (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
               CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]);
        }
        (__return_storage_ptr__->error).final_message._M_string_length = local_298;
        goto LAB_015652de;
      }
    }
    psVar12 = ColumnDefinition::Name_abi_cxx11_(new_field);
    pLVar13 = ColumnDefinition::Type(new_field);
    ::std::
    vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
    ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType_const&>
              ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                *)&local_308,psVar12,pLVar13);
    local_a8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_308;
    local_a8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppStack_300;
    local_a8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2f8;
    local_308 = (pointer)0x0;
    ppStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    LogicalType::STRUCT((LogicalType *)local_230,&local_a8);
    uVar10 = local_2e8._16_8_;
    uVar9 = local_2e8._8_8_;
    local_2e8._0_2_ = local_230._0_2_;
    local_2e8._8_8_ = local_228._M_p;
    local_2e8._16_8_ = auStack_220._0_8_;
    local_228._M_p = (pointer)uVar9;
    auStack_220._0_8_ = uVar10;
    LogicalType::~LogicalType((LogicalType *)local_230);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_a8);
    bVar11 = ColumnDefinition::HasDefaultValue(new_field);
    if (bVar11) {
      pPVar14 = ColumnDefinition::DefaultValue(new_field);
      (*(pPVar14->super_BaseExpression)._vptr_BaseExpression[0xc])(local_230,pPVar14);
      this = local_230;
    }
    else {
      pLVar13 = ColumnDefinition::Type(new_field);
      LogicalType::LogicalType(&local_1b0,pLVar13);
      Value::Value(&local_118,&local_1b0);
      this = (undefined1  [8])operator_new(0x78);
      Value::Value((Value *)local_230,&local_118);
      ConstantExpression::ConstantExpression((ConstantExpression *)this,(Value *)local_230);
      Value::~Value((Value *)local_230);
      Value::~Value(&local_118);
      LogicalType::~LogicalType(&local_1b0);
    }
    local_310._M_head_impl = (ParsedExpression *)this;
    psVar12 = ColumnDefinition::Name_abi_cxx11_(new_field);
    pcVar4 = (psVar12->_M_dataplus)._M_p;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar4,pcVar4 + psVar12->_M_string_length);
    PackExpression((duckdb *)local_230,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_310,&local_178);
    uVar9 = local_2e8._24_8_;
    local_2e8._24_8_ = local_230;
    if ((ConstantExpression *)uVar9 != (ConstantExpression *)0x0) {
      (**(code **)(*(long *)uVar9 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((ConstantExpression *)local_310._M_head_impl != (ConstantExpression *)0x0) {
      (*((BaseExpression *)&((local_310._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_310._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::LogicalType(&__return_storage_ptr__->new_type,(LogicalType *)local_2e8);
    (__return_storage_ptr__->default_value).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)local_2e8._24_8_;
  }
  else {
    local_2f0 = column_path;
    local_248 = depth;
    pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](column_path,__n);
    ppVar8 = ppStack_300;
    if (local_308 != ppStack_300) {
      pLVar13 = &local_308->second;
      do {
        bVar11 = StringUtil::CIEquals
                           ((string *)
                            &pLVar13[-2].type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,pvVar15);
        if (bVar11) {
          AddFieldToStruct(__return_storage_ptr__,pLVar13,local_2f0,new_field,__n);
          if ((__return_storage_ptr__->error).initialized != false) goto LAB_015652e3;
          pLVar13->id_ = (__return_storage_ptr__->new_type).id_;
          pLVar13->physical_type_ = (__return_storage_ptr__->new_type).physical_type_;
          uVar17 = *(undefined4 *)
                    &(pLVar13->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar18 = *(undefined4 *)
                    ((long)&(pLVar13->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          uVar19 = *(undefined4 *)
                    &(pLVar13->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar20 = *(undefined4 *)
                    ((long)&(pLVar13->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pLVar13->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pLVar13->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          peVar5 = (__return_storage_ptr__->new_type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var6 = (__return_storage_ptr__->new_type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (__return_storage_ptr__->new_type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (__return_storage_ptr__->new_type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (pLVar13->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (pLVar13->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
          (pLVar13->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var6;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_d8 = uVar17;
            uStack_d4 = uVar18;
            uStack_d0 = uVar19;
            uStack_cc = uVar20;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            uVar17 = local_d8;
            uVar18 = uStack_d4;
            uVar19 = uStack_d0;
            uVar20 = uStack_cc;
          }
          p_Var2 = (__return_storage_ptr__->new_type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          *(undefined4 *)
           &(__return_storage_ptr__->new_type).type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar17;
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->new_type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
               = uVar18;
          *(undefined4 *)
           &(__return_storage_ptr__->new_type).type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = uVar19;
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->new_type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi + 4) = uVar20;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          local_318._M_head_impl =
               (__return_storage_ptr__->default_value).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (__return_storage_ptr__->default_value).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          p_Var2 = pLVar13[-2].type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,p_Var2,
                     (long)&p_Var2->_vptr__Sp_counted_base + *(long *)(pLVar13 + -1));
          PackExpression((duckdb *)local_230,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&local_318,&local_198);
          uVar9 = local_2e8._24_8_;
          local_2e8._24_8_ = local_230;
          if ((ConstantExpression *)uVar9 != (ConstantExpression *)0x0) {
            (**(code **)(*(long *)uVar9 + 8))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if (local_318._M_head_impl != (ParsedExpression *)0x0) {
            (*((local_318._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_318._M_head_impl = (ParsedExpression *)0x0;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&(__return_storage_ptr__->error).extra_info);
          pcVar4 = (__return_storage_ptr__->error).final_message._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &(__return_storage_ptr__->error).final_message.field_2) {
            operator_delete(pcVar4);
          }
          pcVar4 = (__return_storage_ptr__->error).raw_message._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &(__return_storage_ptr__->error).raw_message.field_2) {
            operator_delete(pcVar4);
          }
          _Var3._M_head_impl =
               (__return_storage_ptr__->default_value).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          }
          (__return_storage_ptr__->default_value).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          LogicalType::~LogicalType(&__return_storage_ptr__->new_type);
          bVar11 = false;
          goto LAB_01564fb0;
        }
        pLVar7 = pLVar13 + 1;
        pLVar13 = (LogicalType *)&pLVar13[2].type_info_;
      } while ((pointer)pLVar7 != ppVar8);
    }
    bVar11 = true;
LAB_01564fb0:
    local_c8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_308;
    local_c8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppStack_300;
    local_c8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2f8;
    local_308 = (pointer)0x0;
    ppStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    LogicalType::STRUCT((LogicalType *)local_230,&local_c8);
    uVar10 = local_2e8._16_8_;
    uVar9 = local_2e8._8_8_;
    local_2e8._0_2_ = local_230._0_2_;
    local_2e8._8_8_ = local_228._M_p;
    local_2e8._16_8_ = auStack_220._0_8_;
    local_228._M_p = (pointer)uVar9;
    auStack_220._0_8_ = uVar10;
    LogicalType::~LogicalType((LogicalType *)local_230);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_c8);
    if (bVar11) {
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      local_230 = (undefined1  [8])auStack_220;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Sub-field %s does not exist in column %s","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar4 = (pvVar15->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar4,pcVar4 + pvVar15->_M_string_length);
      pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](local_2f0,local_248);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar4 = (pvVar15->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + pvVar15->_M_string_length);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (pBVar16,(string *)local_230,&local_70,&local_90);
      __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&__return_storage_ptr__->new_type,(LogicalType *)local_2e8);
    (__return_storage_ptr__->default_value).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)local_2e8._24_8_;
  }
  (__return_storage_ptr__->error).initialized = (bool)local_2c8[0];
  (__return_storage_ptr__->error).type = local_2c8[1];
  paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
  (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_p == &local_2b0) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
         local_2b0._8_8_;
  }
  else {
    (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = local_2c0._M_p;
    (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
         CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]);
  }
  (__return_storage_ptr__->error).raw_message._M_string_length = local_2b8;
  paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
  (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_p == &local_290) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
         local_290._8_8_;
  }
  else {
    (__return_storage_ptr__->error).final_message._M_dataplus._M_p = local_2a0._M_p;
    (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
         CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]);
  }
  (__return_storage_ptr__->error).final_message._M_string_length = local_298;
LAB_015652de:
  local_2a0._M_p = (pointer)&local_290;
  local_2c0._M_p = (pointer)&local_2b0;
  local_290._M_local_buf[0] = '\0';
  local_298 = 0;
  local_2b0._M_local_buf[0] = '\0';
  local_2b8 = 0;
  local_2e8._24_8_ = (ConstantExpression *)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(__return_storage_ptr__->error).extra_info,local_280,local_280);
LAB_015652e3:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_308);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_p != &local_290) {
    operator_delete(local_2a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_p != &local_2b0) {
    operator_delete(local_2c0._M_p);
  }
  if ((ConstantExpression *)local_2e8._24_8_ != (ConstantExpression *)0x0) {
    (**(code **)(*(long *)local_2e8._24_8_ + 8))();
  }
  local_2e8._24_8_ = 0;
  LogicalType::~LogicalType((LogicalType *)local_2e8);
  return __return_storage_ptr__;
}

Assistant:

StructMappingInfo AddFieldToStruct(const LogicalType &type, const vector<string> &column_path,
                                   const ColumnDefinition &new_field, idx_t depth = 0) {
	if (type.id() != LogicalTypeId::STRUCT) {
		throw BinderException("Column %s is not a struct - ALTER TABLE can only add fields to structs",
		                      column_path[depth]);
	}
	StructMappingInfo result;
	auto child_list = StructType::GetChildTypes(type);
	if (column_path.size() == depth + 1) {
		// root path - we are adding at this level
		// check if a field with this name already exists
		for (auto &entry : child_list) {
			if (StringUtil::CIEquals(entry.first, new_field.Name())) {
				// already exists!
				result.error = ErrorData(CatalogException("Duplicate field \"%s\" - field already exists in struct %s",
				                                          new_field.Name(), column_path.back()));
				return result;
			}
		}
		// add the new type
		child_list.emplace_back(new_field.Name(), new_field.Type());
		result.new_type = LogicalType::STRUCT(std::move(child_list));
		// set the default value
		unique_ptr<ParsedExpression> default_value;
		if (new_field.HasDefaultValue()) {
			default_value = new_field.DefaultValue().Copy();
		} else {
			default_value = make_uniq<ConstantExpression>(Value(new_field.Type()));
		}
		result.default_value = PackExpression(std::move(default_value), new_field.Name());
		return result;
	}
	// not the root path - we need to recurse
	auto &next_component = column_path[depth + 1];
	bool found = false;
	for (auto &entry : child_list) {
		if (StringUtil::CIEquals(entry.first, next_component)) {
			// found the entry - recurse
			auto child_res = AddFieldToStruct(entry.second, column_path, new_field, depth + 1);
			if (child_res.error.HasError()) {
				return child_res;
			}
			entry.second = std::move(child_res.new_type);
			result.default_value = PackExpression(std::move(child_res.default_value), entry.first);
			found = true;
			break;
		}
	}
	result.new_type = LogicalType::STRUCT(std::move(child_list));
	if (!found) {
		throw BinderException("Sub-field %s does not exist in column %s", next_component, column_path[depth]);
	}
	return result;
}